

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall
SQCompilation::CodegenVisitor::visitFunctionDecl(CodegenVisitor *this,FunctionDecl *funcDecl)

{
  SQUnsignedInteger *pSVar1;
  SQInstruction *pSVar2;
  SQObjectType SVar3;
  uint uVar4;
  SQTable *pSVar5;
  SQFuncState *pSVar6;
  ParamDecl **ppPVar7;
  Node *this_00;
  long lVar8;
  Block *pBVar9;
  SQFloat SVar10;
  undefined4 uVar11;
  SQObjectFlags SVar12;
  undefined3 uVar13;
  SQFuncState *pSVar14;
  SQString *pSVar15;
  SQInteger SVar16;
  SQObjectValue SVar17;
  SQObjectPtr *p;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  Block *this_01;
  long lVar21;
  SQObject SVar22;
  SQOptimizer opt;
  undefined1 local_68 [8];
  SQObjectValue SStack_60;
  FunctionDecl *local_40;
  SQFuncState *local_38;
  
  lVar20 = (long)(funcDecl->super_Decl).super_Statement.super_Node._coordinates.lineStart;
  if (lVar20 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar20,this->_lineinfo,false);
  }
  local_38 = this->_childFs;
  pSVar14 = SQFuncState::PushChildState(this->_fs,this->_vm->_sharedstate);
  this->_childFs = pSVar14;
  SVar22 = SQFuncState::CreateString(this->_fs,funcDecl->_name,-1);
  pSVar14 = this->_childFs;
  SVar3 = (pSVar14->_name).super_SQObject._type;
  pSVar5 = (pSVar14->_name).super_SQObject._unVal.pTable;
  (pSVar14->_name).super_SQObject = SVar22;
  if ((SVar22._type >> 0x1b & 1) != 0) {
    pSVar1 = &((SVar22._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
              _uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar15 = SQString::Create(this->_vm->_sharedstate,funcDecl->_sourcename,-1);
  pSVar14 = this->_fs;
  pSVar5 = (pSVar14->_sourcename).super_SQObject._unVal.pTable;
  SVar3 = (pSVar14->_sourcename).super_SQObject._type;
  (pSVar14->_sourcename).super_SQObject._type = OT_STRING;
  (pSVar14->_sourcename).super_SQObject._flags = '\0';
  (pSVar14->_sourcename).super_SQObject._unVal.pString = pSVar15;
  pSVar1 = &(pSVar15->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar6 = this->_childFs;
  SVar3 = (pSVar6->_sourcename).super_SQObject._type;
  pSVar5 = (pSVar6->_sourcename).super_SQObject._unVal.pTable;
  SVar12 = (pSVar14->_sourcename).super_SQObject._flags;
  uVar13 = *(undefined3 *)&(pSVar14->_sourcename).super_SQObject.field_0x5;
  SVar10 = (pSVar14->_sourcename).super_SQObject._unVal.fFloat;
  uVar11 = *(undefined4 *)((long)&(pSVar14->_sourcename).super_SQObject._unVal + 4);
  (pSVar6->_sourcename).super_SQObject._type = (pSVar14->_sourcename).super_SQObject._type;
  (pSVar6->_sourcename).super_SQObject._flags = SVar12;
  *(undefined3 *)&(pSVar6->_sourcename).super_SQObject.field_0x5 = uVar13;
  (pSVar6->_sourcename).super_SQObject._unVal.fFloat = SVar10;
  *(undefined4 *)((long)&(pSVar6->_sourcename).super_SQObject._unVal + 4) = uVar11;
  if (((pSVar6->_sourcename).super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &(((pSVar6->_sourcename).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar14 = this->_childFs;
  pSVar14->_varparams = funcDecl->_vararg;
  _local_68 = SQFuncState::CreateString(this->_fs,"this",-1);
  SQFuncState::AddParameter(pSVar14,(SQObject *)local_68);
  uVar19 = (ulong)(funcDecl->_parameters)._size;
  if (uVar19 != 0) {
    ppPVar7 = (funcDecl->_parameters)._vals;
    lVar20 = 0;
    lVar21 = 0;
    local_40 = funcDecl;
    do {
      this_00 = *(Node **)((long)ppPVar7 + lVar20);
      Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
      lVar8._0_4_ = this_00[1]._coordinates.lineStart;
      lVar8._4_4_ = this_00[1]._coordinates.columnStart;
      if (lVar8 != 0) {
        pSVar14 = this->_childFs;
        SVar16 = SQFuncState::TopTarget(this->_fs);
        SQFuncState::AddDefaultParam(pSVar14,SVar16);
        lVar21 = lVar21 + 1;
      }
      funcDecl = local_40;
      lVar20 = lVar20 + 8;
    } while (uVar19 << 3 != lVar20);
    if (0 < lVar21) {
      do {
        SQFuncState::PopTarget(this->_fs);
        lVar21 = lVar21 + -1;
      } while (lVar21 != 0);
    }
  }
  pBVar9 = funcDecl->_body;
  this_01 = pBVar9;
  if ((long)*(int *)&pBVar9->field_0x8 != -1) {
    SQFuncState::AddLineInfos(this->_childFs,(long)*(int *)&pBVar9->field_0x8,this->_lineinfo,false)
    ;
    this_01 = funcDecl->_body;
  }
  pSVar14 = this->_childFs;
  this->_fs = pSVar14;
  this->_childFs = (SQFuncState *)0x0;
  Node::visit<SQCompilation::CodegenVisitor>((Node *)this_01,this);
  this->_childFs = pSVar14;
  this->_fs = pSVar14->_parent;
  SQFuncState::AddLineInfos(pSVar14,(long)*(int *)&pBVar9->field_0x10,this->_lineinfo,true);
  local_68._0_4_ = 0;
  local_68[4] = '\x1d';
  local_68._5_3_ = 0xff;
  SQFuncState::AddInstruction(this->_childFs,(SQInstruction *)local_68);
  pSVar14 = this->_childFs;
  if ((pSVar14->lang_features & 0x200) == 0) {
    SQOptimizer::SQOptimizer((SQOptimizer *)local_68,pSVar14);
    SQOptimizer::optimize((SQOptimizer *)local_68);
    sqvector<SQOptimizer::Jump,_unsigned_int>::~sqvector
              ((sqvector<SQOptimizer::Jump,_unsigned_int> *)local_68);
    pSVar14 = this->_childFs;
  }
  SQFuncState::SetStackSize(pSVar14,0);
  pSVar14 = this->_childFs;
  pSVar14->_hoistLevel = (long)funcDecl->_hoistingLevel;
  SVar17.pFunctionProto = SQFuncState::BuildProto(pSVar14);
  pSVar14 = this->_fs;
  local_68._0_4_ = OT_FUNCPROTO;
  local_68[4] = '\0';
  SStack_60.pTable = SVar17.pTable;
  pSVar1 = &((SVar17.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  uVar4 = (pSVar14->_functions)._allocated;
  uVar18 = (pSVar14->_functions)._size;
  p = (pSVar14->_functions)._vals;
  if (uVar4 <= uVar18) {
    uVar19 = 4;
    if (uVar18 * 2 != 0) {
      uVar19 = (ulong)(uVar18 * 2);
    }
    p = (SQObjectPtr *)
        sq_vm_realloc((pSVar14->_functions)._alloc_ctx,p,(ulong)uVar4 << 4,uVar19 << 4);
    (pSVar14->_functions)._vals = p;
    (pSVar14->_functions)._allocated = (size_type)uVar19;
    uVar18 = (pSVar14->_functions)._size;
  }
  SVar22 = _local_68;
  (pSVar14->_functions)._size = uVar18 + 1;
  pSVar2 = (SQInstruction *)(p + uVar18);
  pSVar2->field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)local_68._0_4_;
  pSVar2->op = local_68[4];
  pSVar2->_arg0 = local_68[5];
  pSVar2->_arg2 = local_68[6];
  pSVar2->_arg3 = local_68[7];
  ((SQObjectValue *)(pSVar2 + 1))->nInteger = (SQInteger)SStack_60;
  if ((p[uVar18].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((p[uVar18].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  _local_68 = SVar22;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_68);
  SQFuncState::PopChildState(this->_fs);
  this->_childFs = local_38;
  pSVar14 = this->_fs;
  SVar16 = SQFuncState::PushTarget(pSVar14,-1);
  SVar22 = _local_68;
  local_68[5] = (char)SVar16;
  local_68._0_4_ = 0;
  local_68[4] = ':';
  local_68._0_4_ = (this->_fs->_functions)._size - 1;
  local_68[6] = funcDecl->_lambda;
  SStack_60 = SVar22._unVal;
  local_68[7] = 0;
  SQFuncState::AddInstruction(pSVar14,(SQInstruction *)local_68);
  return;
}

Assistant:

void CodegenVisitor::visitFunctionDecl(FunctionDecl *funcDecl) {
    addLineNumber(funcDecl);

    SQFuncState *savedChildFsAtRoot = _childFs; // may be non-null when processing default argument that is declared as function/lambda
    _childFs = _fs->PushChildState(_ss(_vm));

    _childFs->_name = _fs->CreateString(funcDecl->name());
    _childFs->_sourcename = _fs->_sourcename = SQString::Create(_ss(_vm), funcDecl->sourceName());
    _childFs->_varparams = funcDecl->isVararg();

    SQInteger defparams = 0;

    _childFs->AddParameter(_fs->CreateString("this"));

    for (auto param : funcDecl->parameters()) {
        param->visit(this);
        if (param->hasDefaultValue()) {
            _childFs->AddDefaultParam(_fs->TopTarget());
            ++defparams;
        }
    }

    for (SQInteger n = 0; n < defparams; n++) {
        _fs->PopTarget();
    }

    Block *body = funcDecl->body();
    SQInteger startLine = body->lineStart();
    if (startLine != -1) {
        _childFs->AddLineInfos(startLine, _lineinfo, false);
    }

    {
        assert(_childFs->_parent == _fs);
        SQFuncState *savedChildFsAtBody = _childFs;
        _fs = _childFs;
        _childFs = NULL;

        funcDecl->body()->visit(this);

        _childFs = savedChildFsAtBody;
        _fs = _childFs->_parent;
    }

    _childFs->AddLineInfos(body->lineEnd(), _lineinfo, true);
    _childFs->AddInstruction(_OP_RETURN, -1);

    if (!(_childFs->lang_features & LF_DISABLE_OPTIMIZER)) {
        SQOptimizer opt(*_childFs);
        opt.optimize();
    }

    _childFs->SetStackSize(0);
    _childFs->_hoistLevel = funcDecl->hoistingLevel();
    SQFunctionProto *funcProto = _childFs->BuildProto();

    _fs->_functions.push_back(funcProto);

    _fs->PopChildState();
    _childFs = savedChildFsAtRoot;

    _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, funcDecl->isLambda() ? 1 : 0);
}